

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

void ecc_montgomery_get_affine(MontgomeryPoint *mp,mp_int **x)

{
  MontgomeryCurve *pMVar1;
  mp_int *pmVar2;
  MontgomeryCurve *mc;
  mp_int **x_local;
  MontgomeryPoint *mp_local;
  
  pMVar1 = mp->mc;
  ecc_montgomery_normalise(mp);
  if (x != (mp_int **)0x0) {
    pmVar2 = monty_export(pMVar1->mc,mp->X);
    *x = pmVar2;
  }
  return;
}

Assistant:

void ecc_montgomery_get_affine(MontgomeryPoint *mp, mp_int **x)
{
    MontgomeryCurve *mc = mp->mc;

    ecc_montgomery_normalise(mp);

    if (x)
        *x = monty_export(mc->mc, mp->X);
}